

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void AddCleanFile(cmMakefile *makefile,string *fileName)

{
  char *value;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *fileName_local;
  cmMakefile *makefile_local;
  
  local_18 = fileName;
  fileName_local = (string *)makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ADDITIONAL_MAKE_CLEAN_FILES",&local_39);
  value = (char *)std::__cxx11::string::c_str();
  cmMakefile::AppendProperty(makefile,&local_38,value,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

static void AddCleanFile(cmMakefile* makefile, std::string const& fileName)
{
  makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES", fileName.c_str(),
                           false);
}